

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::FieldAccessStats::Add(FieldAccessStats *this,FieldAccessStats *other)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  code *pcVar5;
  Type TVar6;
  Type TVar7;
  Type TVar8;
  bool bVar9;
  undefined4 *puVar10;
  
  if (other == (FieldAccessStats *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x39,"(other != nullptr)","other != nullptr");
    if (!bVar9) {
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar10 = 0;
  }
  TVar6 = other->noInfoInlineCacheCount;
  TVar7 = other->monoInlineCacheCount;
  TVar8 = other->emptyMonoInlineCacheCount;
  this->totalInlineCacheCount = this->totalInlineCacheCount + other->totalInlineCacheCount;
  this->noInfoInlineCacheCount = this->noInfoInlineCacheCount + TVar6;
  this->monoInlineCacheCount = this->monoInlineCacheCount + TVar7;
  this->emptyMonoInlineCacheCount = this->emptyMonoInlineCacheCount + TVar8;
  TVar6 = other->nullPolyInlineCacheCount;
  TVar7 = other->emptyPolyInlineCacheCount;
  TVar8 = other->ignoredPolyInlineCacheCount;
  this->polyInlineCacheCount = other->polyInlineCacheCount + this->polyInlineCacheCount;
  this->nullPolyInlineCacheCount = TVar6 + this->nullPolyInlineCacheCount;
  this->emptyPolyInlineCacheCount = TVar7 + this->emptyPolyInlineCacheCount;
  this->ignoredPolyInlineCacheCount = TVar8 + this->ignoredPolyInlineCacheCount;
  TVar6 = other->lowUtilPolyInlineCacheCount;
  TVar7 = other->equivPolyInlineCacheCount;
  TVar8 = other->nonEquivPolyInlineCacheCount;
  this->highUtilPolyInlineCacheCount =
       other->highUtilPolyInlineCacheCount + this->highUtilPolyInlineCacheCount;
  this->lowUtilPolyInlineCacheCount = TVar6 + this->lowUtilPolyInlineCacheCount;
  this->equivPolyInlineCacheCount = TVar7 + this->equivPolyInlineCacheCount;
  this->nonEquivPolyInlineCacheCount = TVar8 + this->nonEquivPolyInlineCacheCount;
  uVar1 = other->disabledPolyInlineCacheCount;
  uVar3 = other->clonedMonoInlineCacheCount;
  uVar2 = this->disabledPolyInlineCacheCount;
  uVar4 = this->clonedMonoInlineCacheCount;
  this->disabledPolyInlineCacheCount = uVar2 + uVar1;
  this->clonedMonoInlineCacheCount = uVar4 + uVar3;
  this->clonedPolyInlineCacheCount =
       this->clonedPolyInlineCacheCount + other->clonedPolyInlineCacheCount;
  return;
}

Assistant:

void FieldAccessStats::Add(FieldAccessStats* other)
    {
        Assert(other != nullptr);
        this->totalInlineCacheCount += other->totalInlineCacheCount;
        this->noInfoInlineCacheCount += other->noInfoInlineCacheCount;
        this->monoInlineCacheCount += other->monoInlineCacheCount;
        this->emptyMonoInlineCacheCount += other->emptyMonoInlineCacheCount;
        this->polyInlineCacheCount += other->polyInlineCacheCount;
        this->nullPolyInlineCacheCount += other->nullPolyInlineCacheCount;
        this->emptyPolyInlineCacheCount += other->emptyPolyInlineCacheCount;
        this->ignoredPolyInlineCacheCount += other->ignoredPolyInlineCacheCount;
        this->highUtilPolyInlineCacheCount += other->highUtilPolyInlineCacheCount;
        this->lowUtilPolyInlineCacheCount += other->lowUtilPolyInlineCacheCount;
        this->equivPolyInlineCacheCount += other->equivPolyInlineCacheCount;
        this->nonEquivPolyInlineCacheCount += other->nonEquivPolyInlineCacheCount;
        this->disabledPolyInlineCacheCount += other->disabledPolyInlineCacheCount;
        this->clonedMonoInlineCacheCount += other->clonedMonoInlineCacheCount;
        this->clonedPolyInlineCacheCount += other->clonedPolyInlineCacheCount;
    }